

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* llm_tokenizer_wpm_session::preprocess
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *text)

{
  uint32_t cpt;
  bool bVar1;
  unicode_cpt_flags uVar2;
  uint32_t cpt_00;
  pointer pbVar3;
  uint32_t *puVar4;
  allocator_type local_6a;
  allocator<char> local_69;
  string s;
  vector<unsigned_int,_std::allocator<unsigned_int>_> cpts_nfd;
  uint32_t *local_40;
  
  unicode_cpts_from_utf8((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s,(string *)text);
  unicode_cpts_normalize_nfd
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&cpts_nfd,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&s);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&s);
  std::__cxx11::string::string<std::allocator<char>>((string *)&s,"",&local_69);
  llama_vocab::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,1,&s,&local_6a);
  std::__cxx11::string::~string((string *)&s);
  puVar4 = _cpts_nfd;
  do {
    if (puVar4 == local_40) {
      if ((__return_storage_ptr__->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length == 0) {
        llama_vocab::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::pop_back(__return_storage_ptr__);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&cpts_nfd);
      return __return_storage_ptr__;
    }
    cpt = *puVar4;
    uVar2 = unicode_cpt_flags_from_cpt(cpt);
    if (((ushort)uVar2 >> 8 & 1) == 0) {
      if (((cpt != 0) && (cpt != 0xfffd)) && (-1 < uVar2._0_1_)) {
        cpt_00 = unicode_tolower(cpt);
        unicode_cpt_to_utf8_abi_cxx11_((string *)&s,cpt_00);
        if ((((ushort)uVar2 & 0x20) == 0) && (((ushort)uVar2 & 0x40) == 0 || 0x7e < cpt)) {
          bVar1 = is_chinese_char(cpt);
          if (bVar1) goto LAB_00255250;
          std::__cxx11::string::append
                    ((string *)
                     ((__return_storage_ptr__->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish + -1));
        }
        else {
LAB_00255250:
          pbVar3 = (__return_storage_ptr__->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if (pbVar3[-1]._M_string_length != 0) {
            llama_vocab::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>(__return_storage_ptr__);
            pbVar3 = (__return_storage_ptr__->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          }
          std::__cxx11::string::_M_assign((string *)(pbVar3 + -1));
          llama_vocab::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::emplace_back<>(__return_storage_ptr__);
        }
        std::__cxx11::string::~string((string *)&s);
      }
    }
    else if ((__return_storage_ptr__->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length != 0) {
      llama_vocab::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::emplace_back<>(__return_storage_ptr__);
    }
    puVar4 = puVar4 + 1;
  } while( true );
}

Assistant:

static std::vector<std::string> preprocess(const std::string & text)  {
        const std::vector<uint32_t> cpts_nfd = unicode_cpts_normalize_nfd(unicode_cpts_from_utf8(text));
        std::vector<std::string> words(1, "");

        for (const uint32_t cpt : cpts_nfd) {
            const auto flags = unicode_cpt_flags_from_cpt(cpt);

            if (flags.is_whitespace) {
                if (words.back().size()) {  // finish previous word if any
                    words.emplace_back();
                }
                continue;
            }

            assert (!flags.is_separator);
            if (cpt == 0 || cpt == 0xFFFD || flags.is_control) {
                continue;
            }

            const std::string s = unicode_cpt_to_utf8(unicode_tolower(cpt));
            if (flags.is_punctuation || ( cpt < 0x7F && flags.is_symbol ) || is_chinese_char(cpt)) {
                if (words.back().size()) {  // finish previous word if any
                    words.emplace_back();
                }
                words.back() = s;       // single char word
                words.emplace_back();   // start a new word
            } else {
                words.back() += s;  // append char to word
            }
        }

        if (!words.back().size()) {
            words.pop_back();
        }

        return words;
    }